

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi_is_hdr(char *filename)

{
  FILE *__stream;
  
  __stream = fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return 0;
}

Assistant:

STBIDEF int      stbi_is_hdr          (char const *filename)
{
   FILE *f = stbi__fopen(filename, "rb");
   int result=0;
   if (f) {
      result = stbi_is_hdr_from_file(f);
      fclose(f);
   }
   return result;
}